

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_atof.h
# Opt level: O1

char * __thiscall Assimp::fast_atoreal_move<float>(Assimp *this,char *c,float *out,bool check_comma)

{
  Assimp *pAVar1;
  Assimp AVar2;
  Assimp AVar3;
  byte bVar4;
  Assimp *pAVar5;
  int iVar6;
  uint64_t uVar7;
  invalid_argument *this_00;
  byte bVar8;
  undefined7 in_register_00000009;
  uint *max_inout;
  undefined1 auVar9 [16];
  float fVar10;
  uint diff;
  Assimp *local_50;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  uint local_2c;
  
  bVar4 = (byte)out;
  AVar2 = *this;
  if ((AVar2 == (Assimp)0x2d) || (local_50 = this, AVar2 == (Assimp)0x2b)) {
    local_50 = this + 1;
  }
  pAVar1 = local_50;
  AVar3 = *local_50;
  if ((byte)AVar3 < 0x69) {
    if (AVar3 != (Assimp)0x49) {
      if (AVar3 != (Assimp)0x4e) goto LAB_00142f96;
LAB_00142f57:
      iVar6 = strncasecmp((char *)local_50,"nan",3);
      if (iVar6 == 0) {
        c[0] = '\0';
        c[1] = '\0';
        c[2] = -0x40;
        c[3] = '\x7f';
        return (char *)(pAVar1 + 3);
      }
      if (((byte)AVar3 | 0x20) != 0x69) goto LAB_00142f96;
    }
  }
  else if (AVar3 != (Assimp)0x69) {
    if (AVar3 != (Assimp)0x6e) goto LAB_00142f96;
    goto LAB_00142f57;
  }
  iVar6 = strncasecmp((char *)pAVar1,"inf",3);
  if (iVar6 == 0) {
    *(undefined4 *)c = *(undefined4 *)(&DAT_001ecb50 + (ulong)(AVar2 == (Assimp)0x2d) * 4);
    local_50 = pAVar1 + 3;
    if (((byte)pAVar1[3] | 0x20) != 0x69) {
      return (char *)local_50;
    }
    iVar6 = strncasecmp((char *)local_50,"inity",5);
    if (iVar6 != 0) {
      return (char *)local_50;
    }
    return (char *)(pAVar1 + 8);
  }
LAB_00142f96:
  if ((9 < (byte)((char)AVar3 - 0x30U)) &&
     (((AVar3 != (Assimp)0x2e & (bVar4 ^ 1 | AVar3 != (Assimp)0x2c)) != 0 ||
      (9 < (byte)((char)pAVar1[1] - 0x30U))))) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,
               "Cannot parse string as real number: does not start with digit or decimal point followed by digit."
              );
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar8 = AVar3 == (Assimp)0x2c & bVar4 | AVar3 == (Assimp)0x2e;
  max_inout = (uint *)CONCAT71(in_register_00000009,bVar8);
  local_48 = 0.0;
  if (bVar8 == 0) {
    uVar7 = strtoul10_64(pAVar1,(char *)&local_50,(char **)0x0,max_inout);
    if ((long)uVar7 < 0) {
      max_inout = (uint *)(uVar7 >> 1);
      local_48 = (float)uVar7;
    }
    else {
      local_48 = (float)(long)uVar7;
    }
  }
  uStack_3c = 0;
  uStack_40 = 0;
  uStack_44 = 0;
  AVar3 = *local_50;
  if (((AVar3 != (Assimp)0x2e & (bVar4 ^ 1 | AVar3 != (Assimp)0x2c)) == 0) &&
     (pAVar1 = local_50 + 1, (byte)((char)*pAVar1 - 0x30U) < 10)) {
    local_50 = local_50 + 1;
    local_2c = 0xf;
    uStack_44 = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    uVar7 = strtoul10_64(local_50,(char *)&local_50,(char **)&local_2c,
                         (uint *)CONCAT71((int7)((ulong)max_inout >> 8),(char)*pAVar1 - 0x30U));
    auVar9._8_4_ = (int)(uVar7 >> 0x20);
    auVar9._0_8_ = uVar7;
    auVar9._12_4_ = 0x45300000;
    local_48 = local_48 +
               (float)(((auVar9._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) *
                      *(double *)(fast_atof_table + (ulong)local_2c * 8));
  }
  else if (AVar3 == (Assimp)0x2e) {
    local_50 = local_50 + 1;
  }
  if (((byte)*local_50 | 0x20) == 0x65) {
    pAVar1 = local_50 + 1;
    AVar3 = local_50[1];
    if ((AVar3 == (Assimp)0x2d) || (pAVar5 = pAVar1, AVar3 == (Assimp)0x2b)) {
      pAVar5 = local_50 + 2;
    }
    local_50 = pAVar5;
    uVar7 = strtoul10_64(local_50,(char *)&local_50,(char **)0x0,(uint *)pAVar1);
    fVar10 = (float)uVar7;
    if (AVar3 == (Assimp)0x2d) {
      fVar10 = -fVar10;
    }
    fVar10 = powf(10.0,fVar10);
    local_48 = local_48 * fVar10;
  }
  if (AVar2 == (Assimp)0x2d) {
    local_48 = -local_48;
  }
  *(float *)c = local_48;
  return (char *)local_50;
}

Assistant:

inline
const char* fast_atoreal_move(const char* c, Real& out, bool check_comma = true) {
    Real f = 0;

    bool inv = (*c == '-');
    if (inv || *c == '+') {
        ++c;
    }

    if ((c[0] == 'N' || c[0] == 'n') && ASSIMP_strincmp(c, "nan", 3) == 0) {
        out = std::numeric_limits<Real>::quiet_NaN();
        c += 3;
        return c;
    }

    if ((c[0] == 'I' || c[0] == 'i') && ASSIMP_strincmp(c, "inf", 3) == 0) {
        out = std::numeric_limits<Real>::infinity();
        if (inv) {
            out = -out;
        }
        c += 3;
        if ((c[0] == 'I' || c[0] == 'i') && ASSIMP_strincmp(c, "inity", 5) == 0) {
            c += 5;
        }
        return c;
     }

    if (!(c[0] >= '0' && c[0] <= '9') &&
            !((c[0] == '.' || (check_comma && c[0] == ',')) && c[1] >= '0' && c[1] <= '9')) {
        throw std::invalid_argument("Cannot parse string "
                                    "as real number: does not start with digit "
                                    "or decimal point followed by digit.");
    }

    if (*c != '.' && (! check_comma || c[0] != ',')) {
        f = static_cast<Real>( strtoul10_64 ( c, &c) );
    }

    if ((*c == '.' || (check_comma && c[0] == ',')) && c[1] >= '0' && c[1] <= '9') {
        ++c;

        // NOTE: The original implementation is highly inaccurate here. The precision of a single
        // IEEE 754 float is not high enough, everything behind the 6th digit tends to be more
        // inaccurate than it would need to be. Casting to double seems to solve the problem.
        // strtol_64 is used to prevent integer overflow.

        // Another fix: this tends to become 0 for long numbers if we don't limit the maximum
        // number of digits to be read. AI_FAST_ATOF_RELAVANT_DECIMALS can be a value between
        // 1 and 15.
        unsigned int diff = AI_FAST_ATOF_RELAVANT_DECIMALS;
        double pl = static_cast<double>( strtoul10_64 ( c, &c, &diff ));

        pl *= fast_atof_table[diff];
        f += static_cast<Real>( pl );
    }
    // For backwards compatibility: eat trailing dots, but not trailing commas.
    else if (*c == '.') {
        ++c;
    }

    // A major 'E' must be allowed. Necessary for proper reading of some DXF files.
    // Thanks to Zhao Lei to point out that this if() must be outside the if (*c == '.' ..)
    if (*c == 'e' || *c == 'E') {
        ++c;
        const bool einv = (*c=='-');
        if (einv || *c=='+') {
            ++c;
        }

        // The reason float constants are used here is that we've seen cases where compilers
        // would perform such casts on compile-time constants at runtime, which would be
        // bad considering how frequently fast_atoreal_move<float> is called in Assimp.
        Real exp = static_cast<Real>( strtoul10_64(c, &c) );
        if (einv) {
            exp = -exp;
        }
        f *= std::pow(static_cast<Real>(10.0), exp);
    }

    if (inv) {
        f = -f;
    }
    out = f;
    return c;
}